

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::OnImportFunc
          (BinaryReaderIR *this,Index import_index,string_view module_name,string_view field_name,
          Index func_index,Index sig_index)

{
  Module *this_00;
  Func *pFVar1;
  pointer *__ptr;
  __uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> local_c8;
  _Head_base<0UL,_wabt::FuncImport_*,_false> local_c0;
  string local_b8;
  string_view local_98;
  string_view local_88;
  Var local_78;
  
  local_98.size_ = field_name.size_;
  local_98.data_ = field_name.data_;
  local_88.size_ = module_name.size_;
  local_88.data_ = module_name.data_;
  MakeUnique<wabt::FuncImport>();
  string_view::to_string_abi_cxx11_(&local_b8,&local_88);
  std::__cxx11::string::operator=
            ((string *)
             &((local_c0._M_head_impl)->super_ImportMixin<(wabt::ExternalKind)0>).super_Import.
              module_name,(string *)&local_b8);
  std::__cxx11::string::_M_dispose();
  string_view::to_string_abi_cxx11_(&local_b8,&local_98);
  std::__cxx11::string::operator=
            ((string *)
             &((local_c0._M_head_impl)->super_ImportMixin<(wabt::ExternalKind)0>).super_Import.
              field_name,(string *)&local_b8);
  std::__cxx11::string::_M_dispose();
  pFVar1 = &(local_c0._M_head_impl)->func;
  GetLocation((Location *)&local_b8,this);
  Var::Var(&local_78,sig_index,(Location *)&local_b8);
  SetFuncDeclaration(this,&pFVar1->decl,&local_78);
  Var::~Var(&local_78);
  this_00 = this->module_;
  GetLocation((Location *)&local_b8,this);
  MakeUnique<wabt::ImportModuleField,std::unique_ptr<wabt::FuncImport,std::default_delete<wabt::FuncImport>>,wabt::Location>
            ((wabt *)&local_c8,
             (unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_> *)&local_c0,
             (Location *)&local_b8);
  Module::AppendField(this_00,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                               *)&local_c8);
  if (local_c8._M_t.
      super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
      .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>)
      0x0) {
    (**(code **)(*(long *)local_c8._M_t.
                          super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                          .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 8)
    )();
  }
  local_c8._M_t.
  super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>.
  super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl =
       (tuple<wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>)
       (_Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>)
       0x0;
  if (local_c0._M_head_impl != (FuncImport *)0x0) {
    (*((local_c0._M_head_impl)->super_ImportMixin<(wabt::ExternalKind)0>).super_Import._vptr_Import
      [1])();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnImportFunc(Index import_index,
                                    string_view module_name,
                                    string_view field_name,
                                    Index func_index,
                                    Index sig_index) {
  auto import = MakeUnique<FuncImport>();
  import->module_name = module_name.to_string();
  import->field_name = field_name.to_string();
  SetFuncDeclaration(&import->func.decl, Var(sig_index, GetLocation()));
  module_->AppendField(
      MakeUnique<ImportModuleField>(std::move(import), GetLocation()));
  return Result::Ok;
}